

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

string * random_hex_string_abi_cxx11_(string *__return_storage_ptr__,uint64_t length)

{
  long lVar1;
  long *in_FS_OFFSET;
  bool bVar2;
  initializer_list<unsigned_int> __il;
  uint local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  if ((char)in_FS_OFFSET[-0x142] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::random_device::random_device((random_device *)(lVar1 + -0x1d98));
    __cxa_thread_atexit(std::random_device::~random_device,(random_device *)(lVar1 + -0x1d98),
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x142) = 1;
  }
  if ((char)in_FS_OFFSET[-0x13e] == '\0') {
    lVar1 = *in_FS_OFFSET;
    local_38 = std::random_device::_M_getval();
    local_34 = std::random_device::_M_getval();
    local_30 = std::random_device::_M_getval();
    local_2c = std::random_device::_M_getval();
    __il._M_len = 4;
    __il._M_array = &local_38;
    std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)(lVar1 + -0xa08),__il);
    __cxa_thread_atexit(std::seed_seq::~seed_seq,(seed_seq *)(lVar1 + -0xa08),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13e) = 1;
  }
  if ((char)in_FS_OFFSET[-4] == '\0') {
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed<std::seed_seq>
              ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)(*in_FS_OFFSET + -0x9e8),(seed_seq *)(*in_FS_OFFSET + -0xa08));
    *(undefined1 *)(in_FS_OFFSET + -4) = 1;
  }
  if (*(char *)((long)in_FS_OFFSET + -0x14) == '\0') {
    *(undefined8 *)((long)in_FS_OFFSET + -0x1c) = 0xf00000000;
    *(undefined1 *)((long)in_FS_OFFSET + -0x14) = 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar1 = *in_FS_OFFSET;
  while (bVar2 = length != 0, length = length - 1, bVar2) {
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)(lVar1 + -0x1c),
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)(lVar1 + -0x9e8));
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string random_hex_string(uint64_t length) {
    constexpr static char charset[] = "0123456789abcdef";
    thread_local static std::random_device rd;
    thread_local static std::seed_seq seed{
        rd(), rd(), rd(), rd()};  // A bit better than pathetic default
    thread_local static std::mt19937_64 random(seed);
    thread_local static std::uniform_int_distribution<int> pick(
        0, sizeof(charset) - 2);

    std::string result;
    result.reserve(length);

    for (uint64_t i = 0; i < length; i++) {
        result += charset[pick(random)];
    }

    return result;
}